

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> __thiscall
kj::Promise<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>>::
attach<kj::OneOf<kj::Array<unsigned_char>,kj::WebSocket::ProtocolError>>
          (Promise<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>> *this,
          OneOf<kj::Array<unsigned_char>,_kj::WebSocket::ProtocolError> *attachments)

{
  Own<kj::_::AttachmentPromiseNode<kj::OneOf<kj::Array<unsigned_char>,_kj::WebSocket::ProtocolError>_>,_kj::_::PromiseDisposer>
  OVar1;
  OneOf<kj::Array<unsigned_char>,_kj::WebSocket::ProtocolError> *in_RDX;
  Own<kj::_::AttachmentPromiseNode<kj::OneOf<kj::Array<unsigned_char>,_kj::WebSocket::ProtocolError>_>,_kj::_::PromiseDisposer>
  local_50;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_48;
  OneOf<kj::Array<unsigned_char>,_kj::WebSocket::ProtocolError> local_40;
  
  OneOf<kj::Array<unsigned_char>,_kj::WebSocket::ProtocolError>::moveFrom(&local_40,in_RDX);
  kj::_::PromiseDisposer::
  appendPromise<kj::_::AttachmentPromiseNode<kj::OneOf<kj::Array<unsigned_char>,kj::WebSocket::ProtocolError>>,kj::_::PromiseDisposer,kj::OneOf<kj::Array<unsigned_char>,kj::WebSocket::ProtocolError>>
            ((PromiseDisposer *)&local_50,(OwnPromiseNode *)attachments,&local_40);
  OVar1.ptr = local_50.ptr;
  local_50.ptr = (AttachmentPromiseNode<kj::OneOf<kj::Array<unsigned_char>,_kj::WebSocket::ProtocolError>_>
                  *)0x0;
  *(AttachmentPromiseNode<kj::OneOf<kj::Array<unsigned_char>,_kj::WebSocket::ProtocolError>_> **)
   this = OVar1.ptr;
  local_48.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_48);
  Own<kj::_::AttachmentPromiseNode<kj::OneOf<kj::Array<unsigned_char>,_kj::WebSocket::ProtocolError>_>,_kj::_::PromiseDisposer>
  ::dispose(&local_50);
  OneOf<kj::Array<unsigned_char>,_kj::WebSocket::ProtocolError>::~OneOf(&local_40);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<T> Promise<T>::attach(Attachments&&... attachments) {
  return Promise(false,
      _::PromiseDisposer::appendPromise<_::AttachmentPromiseNode<Tuple<Attachments...>>>(
          kj::mv(node), kj::tuple(kj::fwd<Attachments>(attachments)...)));
}